

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cc
# Opt level: O0

void __thiscall
tchecker::par_expression_t::par_expression_t
          (par_expression_t *this,shared_ptr<const_tchecker::expression_t> *expr)

{
  element_type *peVar1;
  invalid_argument *this_00;
  shared_ptr<const_tchecker::expression_t> *expr_local;
  par_expression_t *this_local;
  
  expression_t::expression_t((expression_t *)this);
  *(undefined ***)this = &PTR__par_expression_t_004235d0;
  *(undefined ***)this = &PTR__par_expression_t_004235d0;
  std::shared_ptr<const_tchecker::expression_t>::shared_ptr(&this->_expr,expr);
  peVar1 = std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_expr).
                       super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if (peVar1 == (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr sub expression");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

par_expression_t::par_expression_t(std::shared_ptr<tchecker::expression_t const> const & expr) : _expr(expr)
{
  if (_expr.get() == nullptr)
    throw std::invalid_argument("nullptr sub expression");
}